

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O3

void __thiscall re2c::SwitchIf::~SwitchIf(SwitchIf *this)

{
  Cases *this_00;
  ulong uVar1;
  
  if (this->type == IF) {
    this_00 = (Cases *)(this->info).ifs;
    if (this_00 != (Cases *)0x0) {
      If::~If((If *)this_00);
    }
    uVar1 = 0x10;
  }
  else {
    if (this->type != SWITCH) {
      return;
    }
    this_00 = (this->info).cases;
    if (this_00 != (Cases *)0x0) {
      Cases::~Cases(this_00);
    }
    uVar1 = 0x18;
  }
  operator_delete(this_00,uVar1);
  return;
}

Assistant:

SwitchIf::~SwitchIf ()
{
	switch (type)
	{
		case SWITCH:
			delete info.cases;
			break;
		case IF:
			delete info.ifs;
			break;
	}
}